

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

bool __thiscall wasm::WATParser::anon_unknown_10::LexIntCtx::takeHexdigit(LexIntCtx *this)

{
  uint64_t uVar1;
  bool bVar2;
  uint8_t c;
  int *piVar3;
  ulong uVar4;
  uint64_t newN;
  optional<int> h;
  LexIntCtx *this_local;
  
  h.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)this;
  bVar2 = LexCtx::empty(&this->super_LexCtx);
  if (!bVar2) {
    c = LexCtx::peek(&this->super_LexCtx);
    newN = (uint64_t)getHexDigit(c);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&newN);
    if (bVar2) {
      LexCtx::take(&this->super_LexCtx,1);
      uVar1 = this->n;
      piVar3 = std::optional<int>::operator*((optional<int> *)&newN);
      uVar4 = uVar1 * 0x10 + (long)*piVar3;
      if (uVar4 < this->n) {
        this->overflow = true;
      }
      this->n = uVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool takeHexdigit() {
    if (!empty()) {
      if (auto h = getHexDigit(peek())) {
        take(1);
        uint64_t newN = n * 16 + *h;
        if (newN < n) {
          overflow = true;
        }
        n = newN;
        return true;
      }
    }
    return false;
  }